

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipp.hpp
# Opt level: O1

child_t<clipp::parameter,_clipp::group> * __thiscall
clipp::group::child_t<clipp::parameter,_clipp::group>::operator=
          (child_t<clipp::parameter,_clipp::group> *this,
          child_t<clipp::parameter,_clipp::group> *src)

{
  type tVar1;
  
  destroy_content(this);
  tVar1 = src->type_;
  this->type_ = tVar1;
  if (tVar1 == group) {
    group((group *)this,(group *)src);
  }
  else {
    parameter::parameter((parameter *)this,(parameter *)src);
  }
  return this;
}

Assistant:

child_t& operator = (child_t&& src) noexcept {
            destroy_content();
            type_ = src.type_;
            switch(type_) {
                default:
                case type::param: new(&m_)data{std::move(src.m_.param)}; break;
                case type::group: new(&m_)data{std::move(src.m_.group)}; break;
            }
            return *this;
        }